

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePart::StructOperator::Operation<duckdb::date_t>
               (bigint_vec *bigint_values,double_vec *double_values,date_t *input,idx_t idx,
               part_mask_t mask)

{
  int iVar1;
  int32_t iVar2;
  long *plVar3;
  double *pdVar4;
  int64_t iVar5;
  int32_t yyyy;
  int32_t mm;
  int32_t iyyy;
  int32_t ww;
  int32_t dd;
  vector<double_*,_std::allocator<double_*>_> *local_1b8;
  _Vector_base<double_*,_std::allocator<double_*>_> local_1b0;
  _Vector_base<long_*,_std::allocator<long_*>_> local_198;
  _Vector_base<double_*,_std::allocator<double_*>_> local_180;
  _Vector_base<long_*,_std::allocator<long_*>_> local_168;
  _Vector_base<long_*,_std::allocator<long_*>_> local_150;
  _Vector_base<long_*,_std::allocator<long_*>_> local_138;
  _Vector_base<long_*,_std::allocator<long_*>_> local_120;
  _Vector_base<long_*,_std::allocator<long_*>_> local_108;
  _Vector_base<long_*,_std::allocator<long_*>_> local_f0;
  _Vector_base<long_*,_std::allocator<long_*>_> local_d8;
  _Vector_base<long_*,_std::allocator<long_*>_> local_c0;
  _Vector_base<long_*,_std::allocator<long_*>_> local_a8;
  _Vector_base<long_*,_std::allocator<long_*>_> local_90;
  _Vector_base<long_*,_std::allocator<long_*>_> local_78;
  _Vector_base<long_*,_std::allocator<long_*>_> local_60;
  _Vector_base<long_*,_std::allocator<long_*>_> local_48;
  
  mm = 0;
  yyyy = 0x7b2;
  dd = 1;
  local_1b8 = &double_values->super_vector<double_*,_std::allocator<double_*>_>;
  if ((mask & 1) != 0) {
    Date::Convert((date_t)input->days,&yyyy,&mm,&dd);
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_90,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_90,BEGIN_BIGINT);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_90);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)yyyy;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_a8,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_a8,MONTH);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_a8);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)mm;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_c0,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_c0,DAY);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_c0);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)dd;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_d8,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_d8,DECADE);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_d8);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)(yyyy / 10);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_f0,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_f0,CENTURY);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_f0);
    if (plVar3 != (long *)0x0) {
      iVar1 = CenturyOperator::CenturyFromYear<int>(yyyy);
      plVar3[idx] = (long)iVar1;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_108,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_108,MILLENNIUM);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_108);
    if (plVar3 != (long *)0x0) {
      iVar1 = MillenniumOperator::MillenniumFromYear<int>(yyyy);
      plVar3[idx] = (long)iVar1;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_120,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_120,QUARTER);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_120);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)((mm + -1) / 3 + 1);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_138,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_138,ERA);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_138);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (ulong)(0 < yyyy);
    }
  }
  if ((mask & 2) != 0) {
    iVar2 = Date::ExtractISODayOfTheWeek((date_t)input->days);
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_150,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_150,DOW);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_150);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)(iVar2 % 7);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_168,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_168,ISODOW);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_168);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)iVar2;
    }
  }
  if ((mask & 0x40) != 0) {
    ww = 0;
    iyyy = 0;
    Date::ExtractISOYearWeek((date_t)input->days,&iyyy,&ww);
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_48,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_48,WEEK);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_48);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)ww;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_60,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_60,ISOYEAR);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_60);
    if (plVar3 != (long *)0x0) {
      plVar3[idx] = (long)iyyy;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_78,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_78,YEARWEEK);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_78);
    if (plVar3 != (long *)0x0) {
      iVar1 = -ww;
      if (0 < iyyy) {
        iVar1 = ww;
      }
      plVar3[idx] = (long)(iVar1 + iyyy * 100);
    }
  }
  if ((mask & 8) != 0) {
    ::std::vector<double_*,_std::allocator<double_*>_>::vector
              ((vector<double_*,_std::allocator<double_*>_> *)&local_180,local_1b8);
    pdVar4 = HasPartValue<double*>((vector<double_*,_true> *)&local_180,BEGIN_DOUBLE);
    ::std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base(&local_180);
    if (pdVar4 != (double *)0x0) {
      iVar5 = Date::Epoch((date_t)input->days);
      pdVar4[idx] = (double)iVar5;
    }
  }
  if ((mask & 4) != 0) {
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_198,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar3 = HasPartValue<long*>((vector<long_*,_true> *)&local_198,DOY);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_198);
    if (plVar3 != (long *)0x0) {
      iVar2 = Date::ExtractDayOfTheYear((date_t)yyyy);
      plVar3[idx] = (long)iVar2;
    }
  }
  if ((char)mask < '\0') {
    ::std::vector<double_*,_std::allocator<double_*>_>::vector
              ((vector<double_*,_std::allocator<double_*>_> *)&local_1b0,local_1b8);
    pdVar4 = HasPartValue<double*>((vector<double_*,_true> *)&local_1b0,JULIAN_DAY);
    ::std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base(&local_1b0);
    if (pdVar4 != (double *)0x0) {
      iVar5 = Date::ExtractJulianDay((date_t)input->days);
      pdVar4[idx] = (double)iVar5;
    }
  }
  return;
}

Assistant:

static inline void Operation(bigint_vec &bigint_values, double_vec &double_values, const TA &input,
		                             const idx_t idx, const part_mask_t mask) {
			int64_t *bigint_data;
			// YMD calculations
			int32_t yyyy = 1970;
			int32_t mm = 0;
			int32_t dd = 1;
			if (mask & YMD) {
				Date::Convert(input, yyyy, mm, dd);
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::YEAR);
				if (bigint_data) {
					bigint_data[idx] = yyyy;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::MONTH);
				if (bigint_data) {
					bigint_data[idx] = mm;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::DAY);
				if (bigint_data) {
					bigint_data[idx] = dd;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::DECADE);
				if (bigint_data) {
					bigint_data[idx] = DecadeOperator::DecadeFromYear(yyyy);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::CENTURY);
				if (bigint_data) {
					bigint_data[idx] = CenturyOperator::CenturyFromYear(yyyy);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::MILLENNIUM);
				if (bigint_data) {
					bigint_data[idx] = MillenniumOperator::MillenniumFromYear(yyyy);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::QUARTER);
				if (bigint_data) {
					bigint_data[idx] = QuarterOperator::QuarterFromMonth(mm);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::ERA);
				if (bigint_data) {
					bigint_data[idx] = EraOperator::EraFromYear(yyyy);
				}
			}

			// Week calculations
			if (mask & DOW) {
				auto isodow = Date::ExtractISODayOfTheWeek(input);
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::DOW);
				if (bigint_data) {
					bigint_data[idx] = DayOfWeekOperator::DayOfWeekFromISO(isodow);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::ISODOW);
				if (bigint_data) {
					bigint_data[idx] = isodow;
				}
			}

			// ISO calculations
			if (mask & ISO) {
				int32_t ww = 0;
				int32_t iyyy = 0;
				Date::ExtractISOYearWeek(input, iyyy, ww);
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::WEEK);
				if (bigint_data) {
					bigint_data[idx] = ww;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::ISOYEAR);
				if (bigint_data) {
					bigint_data[idx] = iyyy;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::YEARWEEK);
				if (bigint_data) {
					bigint_data[idx] = YearWeekOperator::YearWeekFromParts(iyyy, ww);
				}
			}

			if (mask & EPOCH) {
				auto double_data = HasPartValue(double_values, DatePartSpecifier::EPOCH);
				if (double_data) {
					double_data[idx] = double(Date::Epoch(input));
				}
			}
			if (mask & DOY) {
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::DOY);
				if (bigint_data) {
					bigint_data[idx] = Date::ExtractDayOfTheYear(input);
				}
			}
			if (mask & JD) {
				auto double_data = HasPartValue(double_values, DatePartSpecifier::JULIAN_DAY);
				if (double_data) {
					double_data[idx] = double(Date::ExtractJulianDay(input));
				}
			}
		}